

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::DefaultOrderSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  int iVar1;
  InvalidInputException *this;
  OrderType OVar2;
  string parameter;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Value::ToString_abi_cxx11_(&local_68,input);
  StringUtil::Lower(&local_88,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
  OVar2 = ASCENDING;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
      OVar2 = DESCENDING;
      if (iVar1 != 0) {
        iVar1 = ::std::__cxx11::string::compare((char *)&local_88);
        if (iVar1 != 0) {
          this = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,
                     "Unrecognized parameter for option DEFAULT_ORDER \"%s\". Expected ASC or DESC."
                     ,"");
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_48,local_88._M_dataplus._M_p,
                     local_88._M_dataplus._M_p + local_88._M_string_length);
          InvalidInputException::InvalidInputException<std::__cxx11::string>
                    (this,&local_68,&local_48);
          __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
  }
  (config->options).default_order_type = OVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DefaultOrderSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	auto parameter = StringUtil::Lower(input.ToString());
	if (parameter == "ascending" || parameter == "asc") {
		config.options.default_order_type = OrderType::ASCENDING;
	} else if (parameter == "descending" || parameter == "desc") {
		config.options.default_order_type = OrderType::DESCENDING;
	} else {
		throw InvalidInputException("Unrecognized parameter for option DEFAULT_ORDER \"%s\". Expected ASC or DESC.",
		                            parameter);
	}
}